

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O0

int mriStep_SetDefaults(ARKodeMem ark_mem)

{
  int retval;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  ARKodeMem in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = mriStep_AccessStepMem
                      (in_stack_ffffffffffffffe8,
                       (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
  if (local_4 == 0) {
    *(undefined4 *)&in_stack_ffffffffffffffe8->SRabstol = 3;
    *(undefined4 *)((long)&in_stack_ffffffffffffffe8->SRabstol + 4) = 0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->step_free = 0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->user_data = 0;
    *(undefined4 *)((long)&in_stack_ffffffffffffffe8->user_data + 4) = 1;
    *(undefined4 *)&in_stack_ffffffffffffffe8->reltol = 0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->step_attachlinsol = 3;
    *(undefined8 *)&in_stack_ffffffffffffffe8->step_supports_relaxation = 0x3fb999999999999a;
    in_stack_ffffffffffffffe8->step_printmem = (ARKTimestepPrintMem)0x3fd3333333333333;
    in_stack_ffffffffffffffe8->step_setdefaults = (ARKTimestepSetDefaults)0x4002666666666666;
    in_stack_ffffffffffffffe8->step_reset = (ARKTimestepReset)0x3fc999999999999a;
    *(undefined4 *)&in_stack_ffffffffffffffe8->step_setrelaxfn = 0x14;
    *(undefined4 *)&in_stack_ffffffffffffffe8->VRabstol = 0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->step_init = 0;
    *(undefined8 *)&in_stack_ffffffffffffffe8->atolmin0 = 0;
    in_stack_ffffffffffffffe8->step_fullrhs = (ARKTimestepFullRHSFn)0x0;
    *(undefined4 *)&in_stack_ffffffffffffffe8->step_disablelsetup = 0;
    *(undefined4 *)((long)&in_stack_ffffffffffffffe8->step_attachlinsol + 4) = 0;
    in_stack_ffffffffffffffe8->step_getlinmem = (ARKTimestepGetLinMemFn)0x0;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mriStep_SetDefaults(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Set default values for integrator optional inputs */
  step_mem->q              = 3;        /* method order */
  step_mem->p              = 0;        /* embedding order */
  step_mem->predictor      = 0;        /* trivial predictor */
  step_mem->linear         = SUNFALSE; /* nonlinear problem */
  step_mem->linear_timedep = SUNTRUE;  /* dfs/dy depends on t */
  step_mem->deduce_rhs     = SUNFALSE; /* deduce fi on result of NLS */
  step_mem->maxcor         = MAXCOR;   /* max nonlinear iters/stage */
  step_mem->nlscoef        = NLSCOEF;  /* nonlinear tolerance coefficient */
  step_mem->crdown         = CRDOWN; /* nonlinear convergence estimate coeff. */
  step_mem->rdiv           = RDIV;   /* nonlinear divergence tolerance */
  step_mem->dgmax    = DGMAX; /* max gamma change before recomputing J or P */
  step_mem->msbp     = MSBP;  /* max steps between updates to J or P */
  step_mem->stages   = 0;     /* no stages */
  step_mem->istage   = 0;     /* current stage index */
  step_mem->MRIC     = NULL;  /* no slow->fast coupling */
  step_mem->NLS      = NULL;  /* no nonlinear solver object */
  step_mem->jcur     = SUNFALSE;
  step_mem->convfail = ARK_NO_FAILURES;
  step_mem->stage_predict = NULL; /* no user-supplied stage predictor */
  return (ARK_SUCCESS);
}